

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dspif.c
# Opt level: O1

void describedsp(DspInterface dsp)

{
  if (dsp != (DspInterface)0x0) {
    putchar(10);
    printf("width= %d\n",(ulong)(dsp->Display).width);
    printf("height= %d\n",(ulong)(dsp->Display).height);
    printf("bitsperpixel= %d\n",(ulong)dsp->bitsperpixel);
    printf("colors= %lu\n",dsp->colors);
    printf("graphicsmode= %lu\n",dsp->graphicsmode);
    printf("numberofbanks= %lu\n",dsp->numberofbanks);
    printf("bitblt_to_screen= %p\n",dsp->bitblt_to_screen);
    printf("cleardisplay= %p\n",dsp->cleardisplay);
    fflush(_stdout);
    return;
  }
  puts("describedsp: Not a dsp!");
  return;
}

Assistant:

void describedsp(DspInterface dsp) {
  if (dsp == 0) {
    printf("describedsp: Not a dsp!\n");
    return;
  }

  printf("\n");
  printf("width= %d\n", dsp->Display.width);
  printf("height= %d\n", dsp->Display.height);
  printf("bitsperpixel= %d\n", dsp->bitsperpixel);
  printf("colors= %lu\n", dsp->colors);
  printf("graphicsmode= %lu\n", dsp->graphicsmode);
  printf("numberofbanks= %lu\n", dsp->numberofbanks);
#ifdef DOS
  printf("BytesPerLine= %d\n", dsp->BytesPerLine);
  printf("DisplayStartAddr= %d\n", dsp->DisplayStartAddr);
#endif /* DOS */
  printf("bitblt_to_screen= %p\n", (void *)dsp->bitblt_to_screen);
  printf("cleardisplay= %p\n", (void *)dsp->cleardisplay);
#ifdef DOS
  printf("mouse_visible= %d\n", dsp->mouse_visible);
  printf("mouse_invisible= %d\n", dsp->mouse_invisible);
  printf("\n");
#endif /* DOS */
  fflush(stdout);
}